

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

void __thiscall FIX::shared_array<int>::release(shared_array<int> *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  atomic<long> *tmpCounter;
  int *tmpBuff;
  shared_array<int> *this_local;
  
  bVar2 = empty(this);
  if ((!bVar2) && (lVar3 = decrement_reference_count(this), lVar3 == 0)) {
    pvVar1 = *(void **)(this + 8);
    get_counter(this);
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)this = 0;
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  return;
}

Assistant:

void release() {
    if (empty()) {
      return;
    }

    // free object if reference count has decreased to zero
    if (decrement_reference_count() == 0) {
      T *tmpBuff = m_buffer;
      std::atomic<long> *tmpCounter = get_counter();

      m_buffer = 0;
      m_size = 0;

      // explicitly call destructor for the counter object
      tmpCounter->~atomic<long>();

      delete[] tmpBuff;
    }
  }